

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O0

RK_S32 getDpbSize(H264dVideoCtx_t *p_Vid,H264_SPS_t *active_sps)

{
  uint uVar1;
  RK_U32 RVar2;
  int iValue;
  RK_S32 RVar3;
  RK_S32 local_4c;
  uint local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  RK_S32 size_vui;
  RK_S32 pic_size;
  RK_S32 num_views;
  RK_S32 size;
  H264_SPS_t *active_sps_local;
  H264dVideoCtx_t *p_Vid_local;
  
  uVar1 = (active_sps->pic_width_in_mbs_minus1 + 1) *
          (active_sps->pic_height_in_map_units_minus1 + 1) *
          ((active_sps->frame_mbs_only_flag == 0) + 1) * 0x180;
  switch(active_sps->level_idc) {
  case 9:
    pic_size = 0x25200;
    break;
  case 10:
    pic_size = 0x25200;
    break;
  case 0xb:
    RVar2 = is_prext_profile(active_sps->profile_idc);
    if ((RVar2 == 0) && (active_sps->constrained_set3_flag == 1)) {
      pic_size = 0x25200;
    }
    else {
      pic_size = 0x54600;
    }
    break;
  case 0xc:
    pic_size = 0xdec00;
    break;
  case 0xd:
    pic_size = 0xdec00;
    break;
  default:
    pic_size = 0;
    break;
  case 0x14:
    pic_size = 0xdec00;
    break;
  case 0x15:
    pic_size = 0x1bd800;
    break;
  case 0x16:
    pic_size = 0x2f7600;
    break;
  case 0x1e:
    pic_size = 0x2f7600;
    break;
  case 0x1f:
    pic_size = 0x697800;
    break;
  case 0x20:
    pic_size = 0x780000;
    break;
  case 0x28:
    pic_size = 0xc00000;
    break;
  case 0x29:
    pic_size = 0xc00000;
    break;
  case 0x2a:
    pic_size = 0xcc0000;
    break;
  case 0x32:
    pic_size = 0x286e000;
    break;
  case 0x33:
    pic_size = 0x4380000;
    break;
  case 0x34:
    pic_size = 0x4380000;
  }
  local_44 = pic_size / (int)uVar1;
  if ((p_Vid->active_mvc_sps_flag == 0) ||
     ((p_Vid->profile_idc != 0x76 && (p_Vid->profile_idc != 0x80)))) {
    if (0x10 < local_44) {
      local_44 = 0x10;
    }
    pic_size = local_44;
  }
  else {
    iValue = p_Vid->active_subsps->num_views_minus1 + 1;
    RVar3 = RoundLog2(iValue);
    if (RVar3 < 1) {
      local_38 = 1;
    }
    else {
      local_38 = RoundLog2(iValue);
    }
    if (local_38 * 0x10 < local_44 << 1) {
      RVar3 = RoundLog2(iValue);
      if (RVar3 < 1) {
        local_3c = 1;
      }
      else {
        local_3c = RoundLog2(iValue);
      }
      local_40 = local_3c << 4;
    }
    else {
      local_40 = local_44 << 1;
    }
    pic_size = local_40 / iValue;
  }
  if ((active_sps->vui_parameters_present_flag != 0) &&
     ((active_sps->vui_seq_parameters).bitstream_restriction_flag != 0)) {
    if ((pic_size < (int)(active_sps->vui_seq_parameters).max_dec_frame_buffering) &&
       ((h264d_debug & 4) != 0)) {
      _mpp_log_l(4,"h264d_dpb","warnnig: max_dec_frame_buffering larger than MaxDpbSize",(char *)0x0
                );
    }
    if ((active_sps->vui_seq_parameters).max_dec_frame_buffering == 0) {
      local_48 = 1;
    }
    else {
      local_48 = (active_sps->vui_seq_parameters).max_dec_frame_buffering;
    }
    if (((int)local_48 < pic_size) && ((h264d_debug & 4) != 0)) {
      _mpp_log_l(4,"h264d_dpb",
                 "warning: max_dec_frame_buffering(%d) is less than dpb_size(%d) calculated from Profile/Level.\n"
                 ,(char *)0x0,(ulong)local_48,(ulong)(uint)pic_size);
    }
    pic_size = local_48;
  }
  if (pic_size < active_sps->max_num_ref_frames) {
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_dpb",
                 "warnning: DPB size is less than max_num_ref_frames, level(%d), pic_size(%d), max_num_ref_frames(%d).\n"
                 ,(char *)0x0,(ulong)(uint)active_sps->level_idc,(ulong)uVar1,
                 active_sps->max_num_ref_frames);
    }
    if (active_sps->max_num_ref_frames < 0x11) {
      local_4c = active_sps->max_num_ref_frames;
    }
    else {
      local_4c = 0x10;
    }
    pic_size = local_4c;
  }
  return pic_size;
}

Assistant:

static RK_S32 getDpbSize(H264dVideoCtx_t *p_Vid, H264_SPS_t *active_sps)
{
    RK_S32 size = 0, num_views = 0;
    RK_S32 pic_size = (active_sps->pic_width_in_mbs_minus1 + 1)
                      * (active_sps->pic_height_in_map_units_minus1 + 1) * (active_sps->frame_mbs_only_flag ? 1 : 2) * 384;

    switch (active_sps->level_idc) {
    case 9:
        size = 152064;
        break;
    case 10:
        size = 152064;
        break;
    case 11:
        if (!is_prext_profile(active_sps->profile_idc) && (active_sps->constrained_set3_flag == 1))
            size = 152064;
        else
            size = 345600;
        break;
    case 12:
        size = 912384;
        break;
    case 13:
        size = 912384;
        break;
    case 20:
        size = 912384;
        break;
    case 21:
        size = 1824768;
        break;
    case 22:
        size = 3110400;
        break;
    case 30:
        size = 3110400;
        break;
    case 31:
        size = 6912000;
        break;
    case 32:
        size = 7864320;
        break;
    case 40:
        size = 12582912;
        break;
    case 41:
        size = 12582912;
        break;
    case 42:
        size = 13369344;
        break;
    case 50:
        size = 42393600;
        break;
    case 51:
        size = 70778880;
        break;
    case 52:
        size = 70778880;
        break;
    default:
        size = 0;
        break;
    }
    size /= pic_size;
    if (p_Vid->active_mvc_sps_flag &&
        (p_Vid->profile_idc == H264_PROFILE_MVC_HIGH || p_Vid->profile_idc == H264_PROFILE_STEREO_HIGH)) {
        num_views = p_Vid->active_subsps->num_views_minus1 + 1;
        size = MPP_MIN(2 * size, MPP_MAX(1, RoundLog2(num_views)) * 16) / num_views;
    } else {
        size = MPP_MIN(size, 16);
    }
    if (active_sps->vui_parameters_present_flag && active_sps->vui_seq_parameters.bitstream_restriction_flag) {
        RK_S32 size_vui = 0;
        if ((RK_S32)active_sps->vui_seq_parameters.max_dec_frame_buffering > size) {
            H264D_WARNNING("warnnig: max_dec_frame_buffering larger than MaxDpbSize");
        }
        size_vui = MPP_MAX(1, active_sps->vui_seq_parameters.max_dec_frame_buffering);
        if (size_vui < size) {
            H264D_WARNNING("warning: max_dec_frame_buffering(%d) is less than dpb_size(%d) calculated from Profile/Level.\n", size_vui, size);
        }
        size = size_vui;
    }

    if (size < active_sps->max_num_ref_frames) {
        H264D_WARNNING("warnning: DPB size is less than max_num_ref_frames, level(%d), pic_size(%d), max_num_ref_frames(%d).\n",
                       active_sps->level_idc, pic_size, active_sps->max_num_ref_frames);
        size = MPP_MIN(active_sps->max_num_ref_frames, 16);
    }

    return size;
}